

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O3

void write_buffer_8x8(__m128i *in,uint16_t *output,int stride,int fliplr,int flipud,int shift,int bd
                     )

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  int *piVar3;
  uint16_t *puVar4;
  __m128i alVar5;
  __m128i alVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  long lVar14;
  __m128i *palVar15;
  bool bVar16;
  int iVar17;
  int iVar23;
  int iVar24;
  int iVar25;
  __m128i alVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  __m128i alVar22;
  ushort uVar26;
  uint16_t uVar28;
  int iVar29;
  ushort uVar31;
  uint16_t uVar32;
  ushort uVar33;
  uint16_t uVar34;
  int iVar35;
  ushort uVar36;
  uint16_t uVar37;
  ushort uVar38;
  uint16_t uVar39;
  int iVar40;
  ushort uVar41;
  uint16_t uVar42;
  ushort uVar43;
  uint16_t uVar44;
  int iVar45;
  undefined1 auVar30 [16];
  ushort uVar46;
  uint16_t uVar48;
  ushort uVar49;
  uint16_t uVar50;
  int iVar51;
  ushort uVar53;
  uint16_t uVar54;
  ushort uVar55;
  uint16_t uVar56;
  int iVar57;
  ushort uVar58;
  uint16_t uVar59;
  ushort uVar60;
  uint16_t uVar61;
  int iVar62;
  ushort uVar63;
  uint16_t uVar64;
  ushort uVar65;
  uint16_t uVar66;
  int iVar67;
  undefined1 auVar52 [16];
  ushort uVar68;
  uint16_t uVar69;
  ushort uVar70;
  uint16_t uVar71;
  ushort uVar74;
  uint16_t uVar75;
  ushort uVar76;
  uint16_t uVar77;
  ushort uVar78;
  uint16_t uVar79;
  ushort uVar80;
  uint16_t uVar81;
  ushort uVar82;
  uint16_t uVar83;
  ushort uVar84;
  uint16_t uVar85;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  ushort uVar86;
  uint16_t uVar87;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  short sVar98;
  ushort uVar99;
  short sVar102;
  ushort uVar103;
  short sVar104;
  ushort uVar105;
  short sVar106;
  ushort uVar107;
  short sVar108;
  short sVar109;
  short sVar110;
  undefined1 in_XMM5 [16];
  __m128i max;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  short sVar111;
  ushort uVar112;
  uint16_t uVar113;
  int iVar114;
  uint16_t uVar118;
  ushort uVar119;
  uint16_t uVar120;
  int iVar121;
  uint16_t uVar123;
  ushort uVar124;
  uint16_t uVar125;
  int iVar126;
  uint16_t uVar128;
  ushort uVar129;
  uint16_t uVar130;
  int iVar131;
  undefined1 auVar115 [16];
  ushort uVar117;
  ushort uVar122;
  ushort uVar127;
  ushort uVar132;
  undefined1 auVar116 [16];
  uint16_t uVar133;
  uint16_t uVar134;
  uint16_t uVar138;
  uint16_t uVar139;
  uint16_t uVar140;
  uint16_t uVar141;
  uint16_t uVar142;
  uint16_t uVar143;
  undefined1 in_XMM7 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  uint16_t uVar144;
  ushort uVar145;
  uint16_t uVar146;
  ushort uVar148;
  uint16_t uVar149;
  ushort uVar150;
  uint16_t uVar151;
  ushort uVar152;
  uint16_t uVar153;
  ushort uVar154;
  uint16_t uVar155;
  ushort uVar156;
  uint16_t uVar157;
  ushort uVar158;
  uint16_t uVar159;
  undefined1 auVar147 [16];
  ushort uVar160;
  uint16_t uVar161;
  ushort uVar162;
  uint16_t uVar163;
  ushort uVar167;
  uint16_t uVar168;
  ushort uVar169;
  uint16_t uVar170;
  ushort uVar171;
  uint16_t uVar172;
  ushort uVar173;
  uint16_t uVar174;
  ushort uVar175;
  uint16_t uVar176;
  ushort uVar177;
  uint16_t uVar178;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  ushort uVar179;
  undefined1 auVar166 [16];
  uint16_t uVar180;
  undefined1 in_XMM10 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  int iVar185;
  int iVar188;
  int iVar189;
  int iVar190;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  int iVar191;
  int iVar193;
  int iVar194;
  int iVar195;
  undefined1 auVar192 [16];
  int local_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  int local_88;
  int iStack_84;
  int iStack_80;
  int iStack_7c;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  short sVar27;
  short sVar47;
  int iVar88;
  int iVar95;
  int iVar96;
  int iVar97;
  
  round_shift_8x8(in,shift);
  auVar101 = *(undefined1 (*) [16])output;
  auVar182 = *(undefined1 (*) [16])(output + stride);
  auVar73 = *(undefined1 (*) [16])(output + stride * 2);
  auVar92 = *(undefined1 (*) [16])(output + stride * 3);
  pauVar1 = (undefined1 (*) [16])(output + stride * 4);
  uVar11 = *(undefined8 *)(*pauVar1 + 8);
  alVar5 = *(__m128i *)(output + stride * 5);
  pauVar2 = (undefined1 (*) [16])(output + stride * 6);
  uVar12 = *(undefined8 *)(*pauVar2 + 8);
  uVar13 = *(undefined8 *)(*(undefined1 (*) [16])(output + stride * 7) + 8);
  uVar26 = (ushort)((ulong)uVar11 >> 0x10);
  uVar31 = (ushort)((ulong)uVar11 >> 0x20);
  uVar33 = (ushort)((ulong)uVar11 >> 0x30);
  uVar99 = (ushort)uVar12;
  uVar103 = (ushort)((ulong)uVar12 >> 0x10);
  uVar105 = (ushort)((ulong)uVar12 >> 0x20);
  uVar107 = (ushort)((ulong)uVar12 >> 0x30);
  if (flipud == 0) {
    iVar25 = (int)(*in)[0];
    iVar24 = *(int *)((long)*in + 4);
    iVar23 = (int)(*in)[1];
    iVar17 = *(int *)((long)*in + 0xc);
    iVar185 = (int)in[1][0];
    iVar188 = *(int *)((long)in[1] + 4);
    iVar189 = (int)in[1][1];
    iVar190 = *(int *)((long)in[1] + 0xc);
    bVar16 = fliplr != 0;
    iVar29 = iVar25;
    iVar35 = iVar24;
    iVar40 = iVar23;
    iVar45 = iVar17;
    if (bVar16) {
      iVar29 = iVar190;
      iVar35 = iVar189;
      iVar40 = iVar188;
      iVar45 = iVar185;
      iVar185 = iVar17;
      iVar188 = iVar23;
      iVar189 = iVar24;
      iVar190 = iVar25;
    }
    iVar25 = (int)in[2][0];
    iVar24 = *(int *)((long)in[2] + 4);
    iVar23 = (int)in[2][1];
    iVar17 = *(int *)((long)in[2] + 0xc);
    iVar191 = (int)in[3][0];
    iVar193 = *(int *)((long)in[3] + 4);
    iVar194 = (int)in[3][1];
    iVar195 = *(int *)((long)in[3] + 0xc);
    iVar51 = iVar25;
    iVar57 = iVar24;
    iVar62 = iVar23;
    iVar67 = iVar17;
    if (bVar16) {
      iVar51 = iVar195;
      iVar57 = iVar194;
      iVar62 = iVar193;
      iVar67 = iVar191;
      iVar191 = iVar17;
      iVar193 = iVar23;
      iVar194 = iVar24;
      iVar195 = iVar25;
    }
    iVar25 = (int)in[4][0];
    iVar24 = *(int *)((long)in[4] + 4);
    iVar23 = (int)in[4][1];
    iVar17 = *(int *)((long)in[4] + 0xc);
    alVar6 = in[5];
    alVar22 = alVar6;
    alVar18 = alVar5;
    if (bVar16) {
      alVar22[0]._4_4_ = iVar23;
      alVar22[0]._0_4_ = iVar17;
      alVar22[1]._0_4_ = iVar24;
      alVar22[1]._4_4_ = iVar25;
      iVar17 = (int)alVar6[0];
      iVar23 = alVar6[0]._4_4_;
      iVar24 = (int)alVar6[1];
      iVar25 = alVar6[1]._4_4_;
      alVar18 = alVar22;
    }
    auVar89 = pmovzxwd((undefined1  [16])alVar18,auVar101);
    auVar100 = pmovsxbw(in_XMM5,0x101010101010101);
    auVar135 = pmovzxwd(in_XMM7,auVar182);
    auVar90 = pmovzxwd(auVar89,auVar73);
    iVar7 = (int)in[6][0];
    iVar8 = *(int *)((long)in[6] + 4);
    iVar9 = (int)in[6][1];
    iVar10 = *(int *)((long)in[6] + 0xc);
    iVar88 = (int)in[7][0];
    iVar95 = *(int *)((long)in[7] + 4);
    iVar96 = (int)in[7][1];
    iVar97 = *(int *)((long)in[7] + 0xc);
    auVar181 = pmovzxwd(in_XMM10,auVar92);
    iVar114 = iVar7;
    iVar121 = iVar8;
    iVar126 = iVar9;
    iVar131 = iVar10;
    if (bVar16) {
      iVar114 = iVar97;
      iVar121 = iVar96;
      iVar126 = iVar95;
      iVar131 = iVar88;
      iVar88 = iVar10;
      iVar95 = iVar9;
      iVar96 = iVar8;
      iVar97 = iVar7;
    }
    auVar93._0_4_ = iVar88 + (uint)auVar92._8_2_;
    auVar93._4_4_ = iVar95 + (uint)auVar92._10_2_;
    auVar93._8_4_ = iVar96 + (uint)auVar92._12_2_;
    auVar93._12_4_ = iVar97 + (uint)auVar92._14_2_;
    auVar116._0_4_ = iVar114 + auVar181._0_4_;
    auVar116._4_4_ = iVar121 + auVar181._4_4_;
    auVar116._8_4_ = iVar126 + auVar181._8_4_;
    auVar116._12_4_ = iVar131 + auVar181._12_4_;
    local_98 = auVar89._0_4_;
    iStack_94 = auVar89._4_4_;
    iStack_90 = auVar89._8_4_;
    iStack_8c = auVar89._12_4_;
    auVar92._0_4_ = iVar29 + local_98;
    auVar92._4_4_ = iVar35 + iStack_94;
    auVar92._8_4_ = iVar40 + iStack_90;
    auVar92._12_4_ = iVar45 + iStack_8c;
    auVar187._0_4_ = iVar185 + (uint)auVar101._8_2_;
    auVar187._4_4_ = iVar188 + (uint)auVar101._10_2_;
    auVar187._8_4_ = iVar189 + (uint)auVar101._12_2_;
    auVar187._12_4_ = iVar190 + (uint)auVar101._14_2_;
    auVar100 = psllw(auVar100,ZEXT416((uint)bd));
    auVar89._0_4_ = iVar51 + auVar135._0_4_;
    auVar89._4_4_ = iVar57 + auVar135._4_4_;
    auVar89._8_4_ = iVar62 + auVar135._8_4_;
    auVar89._12_4_ = iVar67 + auVar135._12_4_;
    uStack_74 = (uint)auVar182._10_2_;
    uStack_70 = (uint)auVar182._12_2_;
    uStack_6c = (uint)auVar182._14_2_;
    auVar135._0_4_ = iVar191 + (uint)auVar182._8_2_;
    auVar135._4_4_ = iVar193 + uStack_74;
    auVar135._8_4_ = iVar194 + uStack_70;
    auVar135._12_4_ = iVar195 + uStack_6c;
    local_88 = auVar90._0_4_;
    iStack_84 = auVar90._4_4_;
    iStack_80 = auVar90._8_4_;
    iStack_7c = auVar90._12_4_;
    auVar182._0_4_ = iVar25 + local_88;
    auVar182._4_4_ = iVar24 + iStack_84;
    auVar182._8_4_ = iVar23 + iStack_80;
    auVar182._12_4_ = iVar17 + iStack_7c;
    auVar101._0_4_ = (int)alVar22[0] + (uint)auVar73._8_2_;
    auVar101._4_4_ = alVar22[0]._4_4_ + (uint)auVar73._10_2_;
    auVar101._8_4_ = (int)alVar22[1] + (uint)auVar73._12_2_;
    auVar101._12_4_ = alVar22[1]._4_4_ + (uint)auVar73._14_2_;
    iVar25 = (int)in[8][0];
    iVar24 = *(int *)((long)in[8] + 4);
    iVar23 = (int)in[8][1];
    iVar17 = *(int *)((long)in[8] + 0xc);
    iVar185 = (int)in[9][0];
    iVar188 = *(int *)((long)in[9] + 4);
    iVar189 = (int)in[9][1];
    iVar190 = *(int *)((long)in[9] + 0xc);
    auVar73 = pmovzxwd(auVar181,*pauVar1);
    iVar29 = iVar25;
    iVar35 = iVar24;
    iVar40 = iVar23;
    iVar45 = iVar17;
    if (bVar16) {
      iVar29 = iVar190;
      iVar35 = iVar189;
      iVar40 = iVar188;
      iVar45 = iVar185;
      iVar185 = iVar17;
      iVar188 = iVar23;
      iVar189 = iVar24;
      iVar190 = iVar25;
    }
    auVar181._0_4_ = iVar185 + (uint)(ushort)uVar11;
    auVar181._4_4_ = iVar188 + (uint)uVar26;
    auVar181._8_4_ = iVar189 + (uint)uVar31;
    auVar181._12_4_ = iVar190 + (uint)uVar33;
    auVar90._0_4_ = iVar29 + auVar73._0_4_;
    auVar90._4_4_ = iVar35 + auVar73._4_4_;
    auVar90._8_4_ = iVar40 + auVar73._8_4_;
    auVar90._12_4_ = iVar45 + auVar73._12_4_;
    auVar90 = packusdw(auVar90,auVar181);
    auVar73 = packusdw(auVar92,auVar187);
    sVar98 = auVar100._0_2_ + -1;
    sVar102 = auVar100._2_2_ + -1;
    sVar104 = auVar100._4_2_ + -1;
    sVar106 = auVar100._6_2_ + -1;
    sVar108 = auVar100._8_2_ + -1;
    sVar109 = auVar100._10_2_ + -1;
    sVar110 = auVar100._12_2_ + -1;
    sVar111 = auVar100._14_2_ + -1;
    auVar92 = packusdw(auVar89,auVar135);
    auVar101 = packusdw(auVar182,auVar101);
    auVar89 = packusdw(auVar116,auVar93);
    iVar25 = (int)in[10][0];
    iVar24 = *(int *)((long)in[10] + 4);
    iVar23 = (int)in[10][1];
    iVar17 = *(int *)((long)in[10] + 0xc);
    iVar185 = (int)in[0xb][0];
    iVar188 = *(int *)((long)in[0xb] + 4);
    iVar189 = (int)in[0xb][1];
    iVar190 = *(int *)((long)in[0xb] + 0xc);
    auVar182 = pmovzxwd(auVar93,(undefined1  [16])alVar5);
    iVar29 = iVar25;
    iVar35 = iVar24;
    iVar40 = iVar23;
    iVar45 = iVar17;
    if (bVar16) {
      iVar29 = iVar190;
      iVar35 = iVar189;
      iVar40 = iVar188;
      iVar45 = iVar185;
      iVar185 = iVar17;
      iVar188 = iVar23;
      iVar189 = iVar24;
      iVar190 = iVar25;
    }
    auVar100._0_4_ = iVar185 + (uint)(ushort)alVar5[1];
    auVar100._4_4_ = iVar188 + (uint)alVar5[1]._2_2_;
    auVar100._8_4_ = iVar189 + (uint)alVar5[1]._4_2_;
    auVar100._12_4_ = iVar190 + (uint)alVar5[1]._6_2_;
    auVar166._0_4_ = iVar29 + auVar182._0_4_;
    auVar166._4_4_ = iVar35 + auVar182._4_4_;
    auVar166._8_4_ = iVar40 + auVar182._8_4_;
    auVar166._12_4_ = iVar45 + auVar182._12_4_;
    auVar100 = packusdw(auVar166,auVar100);
    sVar27 = auVar73._0_2_;
    uVar26 = (ushort)(sVar98 < sVar27) * sVar98 | (ushort)(sVar98 >= sVar27) * sVar27;
    sVar27 = auVar73._2_2_;
    uVar31 = (ushort)(sVar102 < sVar27) * sVar102 | (ushort)(sVar102 >= sVar27) * sVar27;
    sVar27 = auVar73._4_2_;
    uVar33 = (ushort)(sVar104 < sVar27) * sVar104 | (ushort)(sVar104 >= sVar27) * sVar27;
    sVar27 = auVar73._6_2_;
    uVar36 = (ushort)(sVar106 < sVar27) * sVar106 | (ushort)(sVar106 >= sVar27) * sVar27;
    sVar27 = auVar73._8_2_;
    uVar38 = (ushort)(sVar108 < sVar27) * sVar108 | (ushort)(sVar108 >= sVar27) * sVar27;
    sVar27 = auVar73._10_2_;
    uVar41 = (ushort)(sVar109 < sVar27) * sVar109 | (ushort)(sVar109 >= sVar27) * sVar27;
    sVar27 = auVar73._12_2_;
    sVar47 = auVar73._14_2_;
    uVar43 = (ushort)(sVar110 < sVar27) * sVar110 | (ushort)(sVar110 >= sVar27) * sVar27;
    uVar46 = (ushort)(sVar111 < sVar47) * sVar111 | (ushort)(sVar111 >= sVar47) * sVar47;
    sVar27 = auVar92._0_2_;
    uVar49 = (ushort)(sVar98 < sVar27) * sVar98 | (ushort)(sVar98 >= sVar27) * sVar27;
    sVar27 = auVar92._2_2_;
    uVar53 = (ushort)(sVar102 < sVar27) * sVar102 | (ushort)(sVar102 >= sVar27) * sVar27;
    sVar27 = auVar92._4_2_;
    uVar55 = (ushort)(sVar104 < sVar27) * sVar104 | (ushort)(sVar104 >= sVar27) * sVar27;
    sVar27 = auVar92._6_2_;
    uVar58 = (ushort)(sVar106 < sVar27) * sVar106 | (ushort)(sVar106 >= sVar27) * sVar27;
    sVar27 = auVar92._8_2_;
    uVar60 = (ushort)(sVar108 < sVar27) * sVar108 | (ushort)(sVar108 >= sVar27) * sVar27;
    sVar27 = auVar92._10_2_;
    uVar63 = (ushort)(sVar109 < sVar27) * sVar109 | (ushort)(sVar109 >= sVar27) * sVar27;
    sVar27 = auVar92._12_2_;
    sVar47 = auVar92._14_2_;
    uVar65 = (ushort)(sVar110 < sVar27) * sVar110 | (ushort)(sVar110 >= sVar27) * sVar27;
    uVar68 = (ushort)(sVar111 < sVar47) * sVar111 | (ushort)(sVar111 >= sVar47) * sVar47;
    sVar27 = auVar101._0_2_;
    uVar70 = (ushort)(sVar98 < sVar27) * sVar98 | (ushort)(sVar98 >= sVar27) * sVar27;
    sVar27 = auVar101._2_2_;
    uVar74 = (ushort)(sVar102 < sVar27) * sVar102 | (ushort)(sVar102 >= sVar27) * sVar27;
    sVar27 = auVar101._4_2_;
    uVar76 = (ushort)(sVar104 < sVar27) * sVar104 | (ushort)(sVar104 >= sVar27) * sVar27;
    sVar27 = auVar101._6_2_;
    uVar78 = (ushort)(sVar106 < sVar27) * sVar106 | (ushort)(sVar106 >= sVar27) * sVar27;
    sVar27 = auVar101._8_2_;
    uVar80 = (ushort)(sVar108 < sVar27) * sVar108 | (ushort)(sVar108 >= sVar27) * sVar27;
    sVar27 = auVar101._10_2_;
    uVar82 = (ushort)(sVar109 < sVar27) * sVar109 | (ushort)(sVar109 >= sVar27) * sVar27;
    sVar27 = auVar101._12_2_;
    sVar47 = auVar101._14_2_;
    uVar84 = (ushort)(sVar110 < sVar27) * sVar110 | (ushort)(sVar110 >= sVar27) * sVar27;
    uVar86 = (ushort)(sVar111 < sVar47) * sVar111 | (ushort)(sVar111 >= sVar47) * sVar47;
    sVar27 = auVar89._0_2_;
    uVar112 = (ushort)(sVar98 < sVar27) * sVar98 | (ushort)(sVar98 >= sVar27) * sVar27;
    sVar27 = auVar89._2_2_;
    uVar117 = (ushort)(sVar102 < sVar27) * sVar102 | (ushort)(sVar102 >= sVar27) * sVar27;
    sVar27 = auVar89._4_2_;
    uVar119 = (ushort)(sVar104 < sVar27) * sVar104 | (ushort)(sVar104 >= sVar27) * sVar27;
    sVar27 = auVar89._6_2_;
    uVar122 = (ushort)(sVar106 < sVar27) * sVar106 | (ushort)(sVar106 >= sVar27) * sVar27;
    sVar27 = auVar89._8_2_;
    uVar124 = (ushort)(sVar108 < sVar27) * sVar108 | (ushort)(sVar108 >= sVar27) * sVar27;
    sVar27 = auVar89._10_2_;
    uVar127 = (ushort)(sVar109 < sVar27) * sVar109 | (ushort)(sVar109 >= sVar27) * sVar27;
    sVar27 = auVar89._12_2_;
    sVar47 = auVar89._14_2_;
    uVar129 = (ushort)(sVar110 < sVar27) * sVar110 | (ushort)(sVar110 >= sVar27) * sVar27;
    uVar132 = (ushort)(sVar111 < sVar47) * sVar111 | (ushort)(sVar111 >= sVar47) * sVar47;
    sVar27 = auVar90._0_2_;
    uVar145 = (ushort)(sVar98 < sVar27) * sVar98 | (ushort)(sVar98 >= sVar27) * sVar27;
    sVar27 = auVar90._2_2_;
    uVar148 = (ushort)(sVar102 < sVar27) * sVar102 | (ushort)(sVar102 >= sVar27) * sVar27;
    sVar27 = auVar90._4_2_;
    uVar150 = (ushort)(sVar104 < sVar27) * sVar104 | (ushort)(sVar104 >= sVar27) * sVar27;
    sVar27 = auVar90._6_2_;
    uVar152 = (ushort)(sVar106 < sVar27) * sVar106 | (ushort)(sVar106 >= sVar27) * sVar27;
    sVar27 = auVar90._8_2_;
    uVar154 = (ushort)(sVar108 < sVar27) * sVar108 | (ushort)(sVar108 >= sVar27) * sVar27;
    sVar27 = auVar90._10_2_;
    uVar156 = (ushort)(sVar109 < sVar27) * sVar109 | (ushort)(sVar109 >= sVar27) * sVar27;
    sVar27 = auVar90._12_2_;
    sVar47 = auVar90._14_2_;
    uVar158 = (ushort)(sVar110 < sVar27) * sVar110 | (ushort)(sVar110 >= sVar27) * sVar27;
    uVar160 = (ushort)(sVar111 < sVar47) * sVar111 | (ushort)(sVar111 >= sVar47) * sVar47;
    sVar27 = auVar100._0_2_;
    uVar162 = (ushort)(sVar98 < sVar27) * sVar98 | (ushort)(sVar98 >= sVar27) * sVar27;
    sVar27 = auVar100._2_2_;
    uVar167 = (ushort)(sVar102 < sVar27) * sVar102 | (ushort)(sVar102 >= sVar27) * sVar27;
    sVar27 = auVar100._4_2_;
    uVar169 = (ushort)(sVar104 < sVar27) * sVar104 | (ushort)(sVar104 >= sVar27) * sVar27;
    sVar27 = auVar100._6_2_;
    uVar171 = (ushort)(sVar106 < sVar27) * sVar106 | (ushort)(sVar106 >= sVar27) * sVar27;
    sVar27 = auVar100._8_2_;
    uVar173 = (ushort)(sVar108 < sVar27) * sVar108 | (ushort)(sVar108 >= sVar27) * sVar27;
    sVar27 = auVar100._10_2_;
    uVar175 = (ushort)(sVar109 < sVar27) * sVar109 | (ushort)(sVar109 >= sVar27) * sVar27;
    sVar27 = auVar100._12_2_;
    sVar47 = auVar100._14_2_;
    uVar177 = (ushort)(sVar110 < sVar27) * sVar110 | (ushort)(sVar110 >= sVar27) * sVar27;
    uVar179 = (ushort)(sVar111 < sVar47) * sVar111 | (ushort)(sVar111 >= sVar47) * sVar47;
    iVar25 = (int)in[0xc][0];
    iVar24 = *(int *)((long)in[0xc] + 4);
    iVar23 = (int)in[0xc][1];
    iVar17 = *(int *)((long)in[0xc] + 0xc);
    iVar185 = (int)in[0xd][0];
    iVar188 = *(int *)((long)in[0xd] + 4);
    iVar189 = (int)in[0xd][1];
    iVar190 = *(int *)((long)in[0xd] + 0xc);
    auVar101 = pmovzxwd(auVar182,*pauVar2);
    iVar29 = iVar25;
    iVar35 = iVar24;
    iVar40 = iVar23;
    iVar45 = iVar17;
    if (bVar16) {
      iVar29 = iVar190;
      iVar35 = iVar189;
      iVar40 = iVar188;
      iVar45 = iVar185;
      iVar185 = iVar17;
      iVar188 = iVar23;
      iVar189 = iVar24;
      iVar190 = iVar25;
    }
    auVar73._0_4_ = iVar185 + (uint)uVar99;
    auVar73._4_4_ = iVar188 + (uint)uVar103;
    auVar73._8_4_ = iVar189 + (uint)uVar105;
    auVar73._12_4_ = iVar190 + (uint)uVar107;
    auVar137._0_4_ = iVar29 + auVar101._0_4_;
    auVar137._4_4_ = iVar35 + auVar101._4_4_;
    auVar137._8_4_ = iVar40 + auVar101._8_4_;
    auVar137._12_4_ = iVar45 + auVar101._12_4_;
    auVar101 = packusdw(auVar137,auVar73);
    uVar28 = (-1 < (short)uVar26) * uVar26;
    uVar32 = (-1 < (short)uVar31) * uVar31;
    uVar34 = (-1 < (short)uVar33) * uVar33;
    uVar37 = (-1 < (short)uVar36) * uVar36;
    uVar39 = (-1 < (short)uVar38) * uVar38;
    uVar42 = (-1 < (short)uVar41) * uVar41;
    uVar44 = (-1 < (short)uVar43) * uVar43;
    uVar48 = (-1 < (short)uVar46) * uVar46;
    uVar50 = (-1 < (short)uVar49) * uVar49;
    uVar54 = (-1 < (short)uVar53) * uVar53;
    uVar56 = (-1 < (short)uVar55) * uVar55;
    uVar59 = (-1 < (short)uVar58) * uVar58;
    uVar61 = (-1 < (short)uVar60) * uVar60;
    uVar64 = (-1 < (short)uVar63) * uVar63;
    uVar66 = (-1 < (short)uVar65) * uVar65;
    uVar69 = (-1 < (short)uVar68) * uVar68;
    uVar71 = (-1 < (short)uVar70) * uVar70;
    uVar75 = (-1 < (short)uVar74) * uVar74;
    uVar77 = (-1 < (short)uVar76) * uVar76;
    uVar79 = (-1 < (short)uVar78) * uVar78;
    uVar81 = (-1 < (short)uVar80) * uVar80;
    uVar83 = (-1 < (short)uVar82) * uVar82;
    uVar85 = (-1 < (short)uVar84) * uVar84;
    uVar87 = (-1 < (short)uVar86) * uVar86;
    uVar113 = (-1 < (short)uVar112) * uVar112;
    uVar118 = (-1 < (short)uVar117) * uVar117;
    uVar120 = (-1 < (short)uVar119) * uVar119;
    uVar123 = (-1 < (short)uVar122) * uVar122;
    uVar125 = (-1 < (short)uVar124) * uVar124;
    uVar128 = (-1 < (short)uVar127) * uVar127;
    uVar130 = (-1 < (short)uVar129) * uVar129;
    uVar133 = (-1 < (short)uVar132) * uVar132;
    uVar146 = (-1 < (short)uVar145) * uVar145;
    uVar149 = (-1 < (short)uVar148) * uVar148;
    uVar151 = (-1 < (short)uVar150) * uVar150;
    uVar153 = (-1 < (short)uVar152) * uVar152;
    uVar155 = (-1 < (short)uVar154) * uVar154;
    uVar157 = (-1 < (short)uVar156) * uVar156;
    uVar159 = (-1 < (short)uVar158) * uVar158;
    uVar161 = (-1 < (short)uVar160) * uVar160;
    uVar163 = (-1 < (short)uVar162) * uVar162;
    uVar168 = (-1 < (short)uVar167) * uVar167;
    uVar170 = (-1 < (short)uVar169) * uVar169;
    uVar172 = (-1 < (short)uVar171) * uVar171;
    uVar174 = (-1 < (short)uVar173) * uVar173;
    uVar176 = (-1 < (short)uVar175) * uVar175;
    uVar178 = (-1 < (short)uVar177) * uVar177;
    uVar180 = (-1 < (short)uVar179) * uVar179;
    sVar27 = auVar101._0_2_;
    uVar26 = (ushort)(sVar98 < sVar27) * sVar98 | (ushort)(sVar98 >= sVar27) * sVar27;
    sVar27 = auVar101._2_2_;
    uVar31 = (ushort)(sVar102 < sVar27) * sVar102 | (ushort)(sVar102 >= sVar27) * sVar27;
    sVar27 = auVar101._4_2_;
    uVar33 = (ushort)(sVar104 < sVar27) * sVar104 | (ushort)(sVar104 >= sVar27) * sVar27;
    sVar27 = auVar101._6_2_;
    uVar36 = (ushort)(sVar106 < sVar27) * sVar106 | (ushort)(sVar106 >= sVar27) * sVar27;
    sVar27 = auVar101._8_2_;
    uVar38 = (ushort)(sVar108 < sVar27) * sVar108 | (ushort)(sVar108 >= sVar27) * sVar27;
    sVar27 = auVar101._10_2_;
    uVar41 = (ushort)(sVar109 < sVar27) * sVar109 | (ushort)(sVar109 >= sVar27) * sVar27;
    sVar27 = auVar101._12_2_;
    sVar47 = auVar101._14_2_;
    uVar43 = (ushort)(sVar110 < sVar27) * sVar110 | (ushort)(sVar110 >= sVar27) * sVar27;
    uVar46 = (ushort)(sVar111 < sVar47) * sVar111 | (ushort)(sVar111 >= sVar47) * sVar47;
    uVar134 = (-1 < (short)uVar26) * uVar26;
    uVar138 = (-1 < (short)uVar31) * uVar31;
    uVar139 = (-1 < (short)uVar33) * uVar33;
    uVar140 = (-1 < (short)uVar36) * uVar36;
    uVar141 = (-1 < (short)uVar38) * uVar38;
    uVar142 = (-1 < (short)uVar41) * uVar41;
    uVar143 = (-1 < (short)uVar43) * uVar43;
    uVar144 = (-1 < (short)uVar46) * uVar46;
    palVar15 = in + 0xe;
    lVar14 = 0xf0;
  }
  else {
    iVar25 = (int)in[0xe][0];
    iVar24 = *(int *)((long)in[0xe] + 4);
    iVar23 = (int)in[0xe][1];
    iVar17 = *(int *)((long)in[0xe] + 0xc);
    iVar185 = (int)in[0xf][0];
    iVar188 = *(int *)((long)in[0xf] + 4);
    iVar189 = (int)in[0xf][1];
    iVar190 = *(int *)((long)in[0xf] + 0xc);
    bVar16 = fliplr != 0;
    iVar29 = iVar25;
    iVar35 = iVar24;
    iVar40 = iVar23;
    iVar45 = iVar17;
    if (bVar16) {
      iVar29 = iVar190;
      iVar35 = iVar189;
      iVar40 = iVar188;
      iVar45 = iVar185;
      iVar185 = iVar17;
      iVar188 = iVar23;
      iVar189 = iVar24;
      iVar190 = iVar25;
    }
    iVar25 = (int)in[0xc][0];
    iVar24 = *(int *)((long)in[0xc] + 4);
    iVar23 = (int)in[0xc][1];
    iVar17 = *(int *)((long)in[0xc] + 0xc);
    iVar191 = (int)in[0xd][0];
    iVar193 = *(int *)((long)in[0xd] + 4);
    iVar194 = (int)in[0xd][1];
    iVar195 = *(int *)((long)in[0xd] + 0xc);
    iVar51 = iVar25;
    iVar57 = iVar24;
    iVar62 = iVar23;
    iVar67 = iVar17;
    if (bVar16) {
      iVar51 = iVar195;
      iVar57 = iVar194;
      iVar62 = iVar193;
      iVar67 = iVar191;
      iVar191 = iVar17;
      iVar193 = iVar23;
      iVar194 = iVar24;
      iVar195 = iVar25;
    }
    iVar25 = (int)in[10][0];
    iVar24 = *(int *)((long)in[10] + 4);
    iVar23 = (int)in[10][1];
    iVar17 = *(int *)((long)in[10] + 0xc);
    alVar6 = in[0xb];
    alVar18 = alVar6;
    alVar22 = alVar5;
    if (bVar16) {
      alVar18[0]._4_4_ = iVar23;
      alVar18[0]._0_4_ = iVar17;
      alVar18[1]._0_4_ = iVar24;
      alVar18[1]._4_4_ = iVar25;
      iVar17 = (int)alVar6[0];
      iVar23 = alVar6[0]._4_4_;
      iVar24 = (int)alVar6[1];
      iVar25 = alVar6[1]._4_4_;
      alVar22 = alVar18;
    }
    auVar89 = pmovzxwd((undefined1  [16])alVar22,auVar101);
    auVar100 = pmovsxbw(in_XMM5,0x101010101010101);
    auVar135 = pmovzxwd(in_XMM7,auVar182);
    auVar90 = pmovzxwd(auVar89,auVar73);
    iVar7 = (int)in[8][0];
    iVar8 = *(int *)((long)in[8] + 4);
    iVar9 = (int)in[8][1];
    iVar10 = *(int *)((long)in[8] + 0xc);
    iVar88 = (int)in[9][0];
    iVar95 = *(int *)((long)in[9] + 4);
    iVar96 = (int)in[9][1];
    iVar97 = *(int *)((long)in[9] + 0xc);
    auVar181 = pmovzxwd(in_XMM10,auVar92);
    iVar114 = iVar7;
    iVar121 = iVar8;
    iVar126 = iVar9;
    iVar131 = iVar10;
    if (bVar16) {
      iVar114 = iVar97;
      iVar121 = iVar96;
      iVar126 = iVar95;
      iVar131 = iVar88;
      iVar88 = iVar10;
      iVar95 = iVar9;
      iVar96 = iVar8;
      iVar97 = iVar7;
    }
    auVar91._0_4_ = iVar88 + (uint)auVar92._8_2_;
    auVar91._4_4_ = iVar95 + (uint)auVar92._10_2_;
    auVar91._8_4_ = iVar96 + (uint)auVar92._12_2_;
    auVar91._12_4_ = iVar97 + (uint)auVar92._14_2_;
    auVar115._0_4_ = iVar114 + auVar181._0_4_;
    auVar115._4_4_ = iVar121 + auVar181._4_4_;
    auVar115._8_4_ = iVar126 + auVar181._8_4_;
    auVar115._12_4_ = iVar131 + auVar181._12_4_;
    local_98 = auVar89._0_4_;
    iStack_94 = auVar89._4_4_;
    iStack_90 = auVar89._8_4_;
    iStack_8c = auVar89._12_4_;
    auVar30._0_4_ = iVar29 + local_98;
    auVar30._4_4_ = iVar35 + iStack_94;
    auVar30._8_4_ = iVar40 + iStack_90;
    auVar30._12_4_ = iVar45 + iStack_8c;
    auVar186._0_4_ = iVar185 + (uint)auVar101._8_2_;
    auVar186._4_4_ = iVar188 + (uint)auVar101._10_2_;
    auVar186._8_4_ = iVar189 + (uint)auVar101._12_2_;
    auVar186._12_4_ = iVar190 + (uint)auVar101._14_2_;
    auVar101 = psllw(auVar100,ZEXT416((uint)bd));
    auVar52._0_4_ = iVar51 + auVar135._0_4_;
    auVar52._4_4_ = iVar57 + auVar135._4_4_;
    auVar52._8_4_ = iVar62 + auVar135._8_4_;
    auVar52._12_4_ = iVar67 + auVar135._12_4_;
    uStack_74 = (uint)auVar182._10_2_;
    uStack_70 = (uint)auVar182._12_2_;
    uStack_6c = (uint)auVar182._14_2_;
    auVar192._0_4_ = iVar191 + (uint)auVar182._8_2_;
    auVar192._4_4_ = iVar193 + uStack_74;
    auVar192._8_4_ = iVar194 + uStack_70;
    auVar192._12_4_ = iVar195 + uStack_6c;
    local_88 = auVar90._0_4_;
    iStack_84 = auVar90._4_4_;
    iStack_80 = auVar90._8_4_;
    iStack_7c = auVar90._12_4_;
    auVar72._0_4_ = iVar25 + local_88;
    auVar72._4_4_ = iVar24 + iStack_84;
    auVar72._8_4_ = iVar23 + iStack_80;
    auVar72._12_4_ = iVar17 + iStack_7c;
    auVar19._0_4_ = (int)alVar18[0] + (uint)auVar73._8_2_;
    auVar19._4_4_ = alVar18[0]._4_4_ + (uint)auVar73._10_2_;
    auVar19._8_4_ = (int)alVar18[1] + (uint)auVar73._12_2_;
    auVar19._12_4_ = alVar18[1]._4_4_ + (uint)auVar73._14_2_;
    iVar25 = (int)in[6][0];
    iVar24 = *(int *)((long)in[6] + 4);
    iVar23 = (int)in[6][1];
    iVar17 = *(int *)((long)in[6] + 0xc);
    iVar185 = (int)in[7][0];
    iVar188 = *(int *)((long)in[7] + 4);
    iVar189 = (int)in[7][1];
    iVar190 = *(int *)((long)in[7] + 0xc);
    auVar182 = pmovzxwd(auVar181,*pauVar1);
    iVar29 = iVar25;
    iVar35 = iVar24;
    iVar40 = iVar23;
    iVar45 = iVar17;
    if (bVar16) {
      iVar29 = iVar190;
      iVar35 = iVar189;
      iVar40 = iVar188;
      iVar45 = iVar185;
      iVar185 = iVar17;
      iVar188 = iVar23;
      iVar189 = iVar24;
      iVar190 = iVar25;
    }
    auVar164._0_4_ = iVar185 + (uint)(ushort)uVar11;
    auVar164._4_4_ = iVar188 + (uint)uVar26;
    auVar164._8_4_ = iVar189 + (uint)uVar31;
    auVar164._12_4_ = iVar190 + (uint)uVar33;
    auVar147._0_4_ = iVar29 + auVar182._0_4_;
    auVar147._4_4_ = iVar35 + auVar182._4_4_;
    auVar147._8_4_ = iVar40 + auVar182._8_4_;
    auVar147._12_4_ = iVar45 + auVar182._12_4_;
    auVar90 = packusdw(auVar147,auVar164);
    auVar182 = packusdw(auVar30,auVar186);
    sVar98 = auVar101._0_2_ + -1;
    sVar102 = auVar101._2_2_ + -1;
    sVar104 = auVar101._4_2_ + -1;
    sVar106 = auVar101._6_2_ + -1;
    sVar108 = auVar101._8_2_ + -1;
    sVar109 = auVar101._10_2_ + -1;
    sVar110 = auVar101._12_2_ + -1;
    sVar111 = auVar101._14_2_ + -1;
    auVar101 = packusdw(auVar52,auVar192);
    auVar73 = packusdw(auVar72,auVar19);
    auVar89 = packusdw(auVar115,auVar91);
    iVar25 = (int)in[4][0];
    iVar24 = *(int *)((long)in[4] + 4);
    iVar23 = (int)in[4][1];
    iVar17 = *(int *)((long)in[4] + 0xc);
    iVar185 = (int)in[5][0];
    iVar188 = *(int *)((long)in[5] + 4);
    iVar189 = (int)in[5][1];
    iVar190 = *(int *)((long)in[5] + 0xc);
    auVar92 = pmovzxwd(auVar91,(undefined1  [16])alVar5);
    iVar29 = iVar25;
    iVar35 = iVar24;
    iVar40 = iVar23;
    iVar45 = iVar17;
    if (bVar16) {
      iVar29 = iVar190;
      iVar35 = iVar189;
      iVar40 = iVar188;
      iVar45 = iVar185;
      iVar185 = iVar17;
      iVar188 = iVar23;
      iVar189 = iVar24;
      iVar190 = iVar25;
    }
    auVar20._0_4_ = iVar185 + (uint)(ushort)alVar5[1];
    auVar20._4_4_ = iVar188 + (uint)alVar5[1]._2_2_;
    auVar20._8_4_ = iVar189 + (uint)alVar5[1]._4_2_;
    auVar20._12_4_ = iVar190 + (uint)alVar5[1]._6_2_;
    auVar165._0_4_ = iVar29 + auVar92._0_4_;
    auVar165._4_4_ = iVar35 + auVar92._4_4_;
    auVar165._8_4_ = iVar40 + auVar92._8_4_;
    auVar165._12_4_ = iVar45 + auVar92._12_4_;
    auVar100 = packusdw(auVar165,auVar20);
    sVar27 = auVar182._0_2_;
    uVar26 = (ushort)(sVar98 < sVar27) * sVar98 | (ushort)(sVar98 >= sVar27) * sVar27;
    sVar27 = auVar182._2_2_;
    uVar31 = (ushort)(sVar102 < sVar27) * sVar102 | (ushort)(sVar102 >= sVar27) * sVar27;
    sVar27 = auVar182._4_2_;
    uVar33 = (ushort)(sVar104 < sVar27) * sVar104 | (ushort)(sVar104 >= sVar27) * sVar27;
    sVar27 = auVar182._6_2_;
    uVar36 = (ushort)(sVar106 < sVar27) * sVar106 | (ushort)(sVar106 >= sVar27) * sVar27;
    sVar27 = auVar182._8_2_;
    uVar38 = (ushort)(sVar108 < sVar27) * sVar108 | (ushort)(sVar108 >= sVar27) * sVar27;
    sVar27 = auVar182._10_2_;
    uVar41 = (ushort)(sVar109 < sVar27) * sVar109 | (ushort)(sVar109 >= sVar27) * sVar27;
    sVar27 = auVar182._12_2_;
    sVar47 = auVar182._14_2_;
    uVar43 = (ushort)(sVar110 < sVar27) * sVar110 | (ushort)(sVar110 >= sVar27) * sVar27;
    uVar46 = (ushort)(sVar111 < sVar47) * sVar111 | (ushort)(sVar111 >= sVar47) * sVar47;
    sVar27 = auVar101._0_2_;
    uVar49 = (ushort)(sVar98 < sVar27) * sVar98 | (ushort)(sVar98 >= sVar27) * sVar27;
    sVar27 = auVar101._2_2_;
    uVar53 = (ushort)(sVar102 < sVar27) * sVar102 | (ushort)(sVar102 >= sVar27) * sVar27;
    sVar27 = auVar101._4_2_;
    uVar55 = (ushort)(sVar104 < sVar27) * sVar104 | (ushort)(sVar104 >= sVar27) * sVar27;
    sVar27 = auVar101._6_2_;
    uVar58 = (ushort)(sVar106 < sVar27) * sVar106 | (ushort)(sVar106 >= sVar27) * sVar27;
    sVar27 = auVar101._8_2_;
    uVar60 = (ushort)(sVar108 < sVar27) * sVar108 | (ushort)(sVar108 >= sVar27) * sVar27;
    sVar27 = auVar101._10_2_;
    uVar63 = (ushort)(sVar109 < sVar27) * sVar109 | (ushort)(sVar109 >= sVar27) * sVar27;
    sVar27 = auVar101._12_2_;
    sVar47 = auVar101._14_2_;
    uVar65 = (ushort)(sVar110 < sVar27) * sVar110 | (ushort)(sVar110 >= sVar27) * sVar27;
    uVar68 = (ushort)(sVar111 < sVar47) * sVar111 | (ushort)(sVar111 >= sVar47) * sVar47;
    sVar27 = auVar73._0_2_;
    uVar70 = (ushort)(sVar98 < sVar27) * sVar98 | (ushort)(sVar98 >= sVar27) * sVar27;
    sVar27 = auVar73._2_2_;
    uVar74 = (ushort)(sVar102 < sVar27) * sVar102 | (ushort)(sVar102 >= sVar27) * sVar27;
    sVar27 = auVar73._4_2_;
    uVar76 = (ushort)(sVar104 < sVar27) * sVar104 | (ushort)(sVar104 >= sVar27) * sVar27;
    sVar27 = auVar73._6_2_;
    uVar78 = (ushort)(sVar106 < sVar27) * sVar106 | (ushort)(sVar106 >= sVar27) * sVar27;
    sVar27 = auVar73._8_2_;
    uVar80 = (ushort)(sVar108 < sVar27) * sVar108 | (ushort)(sVar108 >= sVar27) * sVar27;
    sVar27 = auVar73._10_2_;
    uVar82 = (ushort)(sVar109 < sVar27) * sVar109 | (ushort)(sVar109 >= sVar27) * sVar27;
    sVar27 = auVar73._12_2_;
    sVar47 = auVar73._14_2_;
    uVar84 = (ushort)(sVar110 < sVar27) * sVar110 | (ushort)(sVar110 >= sVar27) * sVar27;
    uVar86 = (ushort)(sVar111 < sVar47) * sVar111 | (ushort)(sVar111 >= sVar47) * sVar47;
    sVar27 = auVar89._0_2_;
    uVar112 = (ushort)(sVar98 < sVar27) * sVar98 | (ushort)(sVar98 >= sVar27) * sVar27;
    sVar27 = auVar89._2_2_;
    uVar117 = (ushort)(sVar102 < sVar27) * sVar102 | (ushort)(sVar102 >= sVar27) * sVar27;
    sVar27 = auVar89._4_2_;
    uVar119 = (ushort)(sVar104 < sVar27) * sVar104 | (ushort)(sVar104 >= sVar27) * sVar27;
    sVar27 = auVar89._6_2_;
    uVar122 = (ushort)(sVar106 < sVar27) * sVar106 | (ushort)(sVar106 >= sVar27) * sVar27;
    sVar27 = auVar89._8_2_;
    uVar124 = (ushort)(sVar108 < sVar27) * sVar108 | (ushort)(sVar108 >= sVar27) * sVar27;
    sVar27 = auVar89._10_2_;
    uVar127 = (ushort)(sVar109 < sVar27) * sVar109 | (ushort)(sVar109 >= sVar27) * sVar27;
    sVar27 = auVar89._12_2_;
    sVar47 = auVar89._14_2_;
    uVar129 = (ushort)(sVar110 < sVar27) * sVar110 | (ushort)(sVar110 >= sVar27) * sVar27;
    uVar132 = (ushort)(sVar111 < sVar47) * sVar111 | (ushort)(sVar111 >= sVar47) * sVar47;
    sVar27 = auVar90._0_2_;
    uVar145 = (ushort)(sVar98 < sVar27) * sVar98 | (ushort)(sVar98 >= sVar27) * sVar27;
    sVar27 = auVar90._2_2_;
    uVar148 = (ushort)(sVar102 < sVar27) * sVar102 | (ushort)(sVar102 >= sVar27) * sVar27;
    sVar27 = auVar90._4_2_;
    uVar150 = (ushort)(sVar104 < sVar27) * sVar104 | (ushort)(sVar104 >= sVar27) * sVar27;
    sVar27 = auVar90._6_2_;
    uVar152 = (ushort)(sVar106 < sVar27) * sVar106 | (ushort)(sVar106 >= sVar27) * sVar27;
    sVar27 = auVar90._8_2_;
    uVar154 = (ushort)(sVar108 < sVar27) * sVar108 | (ushort)(sVar108 >= sVar27) * sVar27;
    sVar27 = auVar90._10_2_;
    uVar156 = (ushort)(sVar109 < sVar27) * sVar109 | (ushort)(sVar109 >= sVar27) * sVar27;
    sVar27 = auVar90._12_2_;
    sVar47 = auVar90._14_2_;
    uVar158 = (ushort)(sVar110 < sVar27) * sVar110 | (ushort)(sVar110 >= sVar27) * sVar27;
    uVar160 = (ushort)(sVar111 < sVar47) * sVar111 | (ushort)(sVar111 >= sVar47) * sVar47;
    iVar25 = (int)in[2][0];
    iVar24 = *(int *)((long)in[2] + 4);
    iVar23 = (int)in[2][1];
    iVar17 = *(int *)((long)in[2] + 0xc);
    iVar185 = (int)in[3][0];
    iVar188 = *(int *)((long)in[3] + 4);
    iVar189 = (int)in[3][1];
    iVar190 = *(int *)((long)in[3] + 0xc);
    sVar27 = auVar100._0_2_;
    uVar162 = (ushort)(sVar98 < sVar27) * sVar98 | (ushort)(sVar98 >= sVar27) * sVar27;
    sVar27 = auVar100._2_2_;
    uVar167 = (ushort)(sVar102 < sVar27) * sVar102 | (ushort)(sVar102 >= sVar27) * sVar27;
    sVar27 = auVar100._4_2_;
    uVar169 = (ushort)(sVar104 < sVar27) * sVar104 | (ushort)(sVar104 >= sVar27) * sVar27;
    sVar27 = auVar100._6_2_;
    uVar171 = (ushort)(sVar106 < sVar27) * sVar106 | (ushort)(sVar106 >= sVar27) * sVar27;
    sVar27 = auVar100._8_2_;
    uVar173 = (ushort)(sVar108 < sVar27) * sVar108 | (ushort)(sVar108 >= sVar27) * sVar27;
    sVar27 = auVar100._10_2_;
    uVar175 = (ushort)(sVar109 < sVar27) * sVar109 | (ushort)(sVar109 >= sVar27) * sVar27;
    sVar27 = auVar100._12_2_;
    sVar47 = auVar100._14_2_;
    uVar177 = (ushort)(sVar110 < sVar27) * sVar110 | (ushort)(sVar110 >= sVar27) * sVar27;
    uVar179 = (ushort)(sVar111 < sVar47) * sVar111 | (ushort)(sVar111 >= sVar47) * sVar47;
    auVar101 = pmovzxwd(auVar92,*pauVar2);
    iVar29 = iVar25;
    iVar35 = iVar24;
    iVar40 = iVar23;
    iVar45 = iVar17;
    if (bVar16) {
      iVar29 = iVar190;
      iVar35 = iVar189;
      iVar40 = iVar188;
      iVar45 = iVar185;
      iVar185 = iVar17;
      iVar188 = iVar23;
      iVar189 = iVar24;
      iVar190 = iVar25;
    }
    auVar21._0_4_ = iVar185 + (uint)uVar99;
    auVar21._4_4_ = iVar188 + (uint)uVar103;
    auVar21._8_4_ = iVar189 + (uint)uVar105;
    auVar21._12_4_ = iVar190 + (uint)uVar107;
    auVar136._0_4_ = iVar29 + auVar101._0_4_;
    auVar136._4_4_ = iVar35 + auVar101._4_4_;
    auVar136._8_4_ = iVar40 + auVar101._8_4_;
    auVar136._12_4_ = iVar45 + auVar101._12_4_;
    auVar101 = packusdw(auVar136,auVar21);
    uVar28 = (-1 < (short)uVar26) * uVar26;
    uVar32 = (-1 < (short)uVar31) * uVar31;
    uVar34 = (-1 < (short)uVar33) * uVar33;
    uVar37 = (-1 < (short)uVar36) * uVar36;
    uVar39 = (-1 < (short)uVar38) * uVar38;
    uVar42 = (-1 < (short)uVar41) * uVar41;
    uVar44 = (-1 < (short)uVar43) * uVar43;
    uVar48 = (-1 < (short)uVar46) * uVar46;
    uVar50 = (-1 < (short)uVar49) * uVar49;
    uVar54 = (-1 < (short)uVar53) * uVar53;
    uVar56 = (-1 < (short)uVar55) * uVar55;
    uVar59 = (-1 < (short)uVar58) * uVar58;
    uVar61 = (-1 < (short)uVar60) * uVar60;
    uVar64 = (-1 < (short)uVar63) * uVar63;
    uVar66 = (-1 < (short)uVar65) * uVar65;
    uVar69 = (-1 < (short)uVar68) * uVar68;
    uVar71 = (-1 < (short)uVar70) * uVar70;
    uVar75 = (-1 < (short)uVar74) * uVar74;
    uVar77 = (-1 < (short)uVar76) * uVar76;
    uVar79 = (-1 < (short)uVar78) * uVar78;
    uVar81 = (-1 < (short)uVar80) * uVar80;
    uVar83 = (-1 < (short)uVar82) * uVar82;
    uVar85 = (-1 < (short)uVar84) * uVar84;
    uVar87 = (-1 < (short)uVar86) * uVar86;
    uVar113 = (-1 < (short)uVar112) * uVar112;
    uVar118 = (-1 < (short)uVar117) * uVar117;
    uVar120 = (-1 < (short)uVar119) * uVar119;
    uVar123 = (-1 < (short)uVar122) * uVar122;
    uVar125 = (-1 < (short)uVar124) * uVar124;
    uVar128 = (-1 < (short)uVar127) * uVar127;
    uVar130 = (-1 < (short)uVar129) * uVar129;
    uVar133 = (-1 < (short)uVar132) * uVar132;
    uVar146 = (-1 < (short)uVar145) * uVar145;
    uVar149 = (-1 < (short)uVar148) * uVar148;
    uVar151 = (-1 < (short)uVar150) * uVar150;
    uVar153 = (-1 < (short)uVar152) * uVar152;
    uVar155 = (-1 < (short)uVar154) * uVar154;
    uVar157 = (-1 < (short)uVar156) * uVar156;
    uVar159 = (-1 < (short)uVar158) * uVar158;
    uVar161 = (-1 < (short)uVar160) * uVar160;
    uVar163 = (-1 < (short)uVar162) * uVar162;
    uVar168 = (-1 < (short)uVar167) * uVar167;
    uVar170 = (-1 < (short)uVar169) * uVar169;
    uVar172 = (-1 < (short)uVar171) * uVar171;
    uVar174 = (-1 < (short)uVar173) * uVar173;
    uVar176 = (-1 < (short)uVar175) * uVar175;
    uVar178 = (-1 < (short)uVar177) * uVar177;
    uVar180 = (-1 < (short)uVar179) * uVar179;
    sVar27 = auVar101._0_2_;
    uVar26 = (ushort)(sVar98 < sVar27) * sVar98 | (ushort)(sVar98 >= sVar27) * sVar27;
    sVar27 = auVar101._2_2_;
    uVar31 = (ushort)(sVar102 < sVar27) * sVar102 | (ushort)(sVar102 >= sVar27) * sVar27;
    sVar27 = auVar101._4_2_;
    uVar33 = (ushort)(sVar104 < sVar27) * sVar104 | (ushort)(sVar104 >= sVar27) * sVar27;
    sVar27 = auVar101._6_2_;
    uVar36 = (ushort)(sVar106 < sVar27) * sVar106 | (ushort)(sVar106 >= sVar27) * sVar27;
    sVar27 = auVar101._8_2_;
    uVar38 = (ushort)(sVar108 < sVar27) * sVar108 | (ushort)(sVar108 >= sVar27) * sVar27;
    sVar27 = auVar101._10_2_;
    uVar41 = (ushort)(sVar109 < sVar27) * sVar109 | (ushort)(sVar109 >= sVar27) * sVar27;
    sVar27 = auVar101._12_2_;
    sVar47 = auVar101._14_2_;
    uVar43 = (ushort)(sVar110 < sVar27) * sVar110 | (ushort)(sVar110 >= sVar27) * sVar27;
    uVar46 = (ushort)(sVar111 < sVar47) * sVar111 | (ushort)(sVar111 >= sVar47) * sVar47;
    uVar134 = (-1 < (short)uVar26) * uVar26;
    uVar138 = (-1 < (short)uVar31) * uVar31;
    uVar139 = (-1 < (short)uVar33) * uVar33;
    uVar140 = (-1 < (short)uVar36) * uVar36;
    uVar141 = (-1 < (short)uVar38) * uVar38;
    uVar142 = (-1 < (short)uVar41) * uVar41;
    uVar143 = (-1 < (short)uVar43) * uVar43;
    uVar144 = (-1 < (short)uVar46) * uVar46;
    lVar14 = 0x10;
    palVar15 = in;
  }
  auVar184._2_2_ = 0;
  auVar184._0_2_ = uVar99;
  auVar184._4_2_ = uVar103;
  auVar184._6_2_ = 0;
  auVar184._8_2_ = uVar105;
  auVar184._10_2_ = 0;
  auVar184._12_2_ = uVar107;
  auVar184._14_2_ = 0;
  iVar25 = (int)(*palVar15)[0];
  iVar24 = *(int *)((long)*palVar15 + 4);
  iVar23 = (int)(*palVar15)[1];
  iVar17 = *(int *)((long)*palVar15 + 0xc);
  piVar3 = (int *)((long)*in + lVar14);
  auVar101 = pmovzxwd(auVar184,*(undefined1 (*) [16])(output + stride * 7));
  iVar185 = iVar25;
  iVar188 = iVar24;
  iVar189 = iVar23;
  iVar190 = iVar17;
  iVar29 = *piVar3;
  iVar35 = piVar3[1];
  iVar40 = piVar3[2];
  iVar45 = piVar3[3];
  if (fliplr != 0) {
    iVar185 = piVar3[3];
    iVar188 = piVar3[2];
    iVar189 = piVar3[1];
    iVar190 = *piVar3;
    iVar29 = iVar17;
    iVar35 = iVar23;
    iVar40 = iVar24;
    iVar45 = iVar25;
  }
  auVar183._0_4_ = iVar29 + (uint)(ushort)uVar13;
  auVar183._4_4_ = iVar35 + (uint)(ushort)((ulong)uVar13 >> 0x10);
  auVar183._8_4_ = iVar40 + (uint)(ushort)((ulong)uVar13 >> 0x20);
  auVar183._12_4_ = iVar45 + (uint)(ushort)((ulong)uVar13 >> 0x30);
  auVar94._0_4_ = iVar185 + auVar101._0_4_;
  auVar94._4_4_ = iVar188 + auVar101._4_4_;
  auVar94._8_4_ = iVar189 + auVar101._8_4_;
  auVar94._12_4_ = iVar190 + auVar101._12_4_;
  auVar101 = packusdw(auVar94,auVar183);
  sVar27 = auVar101._0_2_;
  uVar99 = (ushort)(sVar27 < sVar98) * sVar27 | (ushort)(sVar27 >= sVar98) * sVar98;
  sVar98 = auVar101._2_2_;
  uVar103 = (ushort)(sVar98 < sVar102) * sVar98 | (ushort)(sVar98 >= sVar102) * sVar102;
  sVar98 = auVar101._4_2_;
  uVar105 = (ushort)(sVar98 < sVar104) * sVar98 | (ushort)(sVar98 >= sVar104) * sVar104;
  sVar98 = auVar101._6_2_;
  uVar107 = (ushort)(sVar98 < sVar106) * sVar98 | (ushort)(sVar98 >= sVar106) * sVar106;
  sVar98 = auVar101._8_2_;
  uVar26 = (ushort)(sVar98 < sVar108) * sVar98 | (ushort)(sVar98 >= sVar108) * sVar108;
  sVar98 = auVar101._10_2_;
  uVar31 = (ushort)(sVar98 < sVar109) * sVar98 | (ushort)(sVar98 >= sVar109) * sVar109;
  sVar98 = auVar101._12_2_;
  uVar33 = (ushort)(sVar98 < sVar110) * sVar98 | (ushort)(sVar98 >= sVar110) * sVar110;
  sVar98 = auVar101._14_2_;
  uVar36 = (ushort)(sVar98 < sVar111) * sVar98 | (ushort)(sVar98 >= sVar111) * sVar111;
  *output = uVar28;
  output[1] = uVar32;
  output[2] = uVar34;
  output[3] = uVar37;
  output[4] = uVar39;
  output[5] = uVar42;
  output[6] = uVar44;
  output[7] = uVar48;
  puVar4 = output + stride;
  *puVar4 = uVar50;
  puVar4[1] = uVar54;
  puVar4[2] = uVar56;
  puVar4[3] = uVar59;
  puVar4[4] = uVar61;
  puVar4[5] = uVar64;
  puVar4[6] = uVar66;
  puVar4[7] = uVar69;
  puVar4 = output + stride * 2;
  *puVar4 = uVar71;
  puVar4[1] = uVar75;
  puVar4[2] = uVar77;
  puVar4[3] = uVar79;
  puVar4[4] = uVar81;
  puVar4[5] = uVar83;
  puVar4[6] = uVar85;
  puVar4[7] = uVar87;
  puVar4 = output + stride * 3;
  *puVar4 = uVar113;
  puVar4[1] = uVar118;
  puVar4[2] = uVar120;
  puVar4[3] = uVar123;
  puVar4[4] = uVar125;
  puVar4[5] = uVar128;
  puVar4[6] = uVar130;
  puVar4[7] = uVar133;
  puVar4 = output + stride * 4;
  *puVar4 = uVar146;
  puVar4[1] = uVar149;
  puVar4[2] = uVar151;
  puVar4[3] = uVar153;
  puVar4[4] = uVar155;
  puVar4[5] = uVar157;
  puVar4[6] = uVar159;
  puVar4[7] = uVar161;
  puVar4 = output + stride * 5;
  *puVar4 = uVar163;
  puVar4[1] = uVar168;
  puVar4[2] = uVar170;
  puVar4[3] = uVar172;
  puVar4[4] = uVar174;
  puVar4[5] = uVar176;
  puVar4[6] = uVar178;
  puVar4[7] = uVar180;
  puVar4 = output + stride * 6;
  *puVar4 = uVar134;
  puVar4[1] = uVar138;
  puVar4[2] = uVar139;
  puVar4[3] = uVar140;
  puVar4[4] = uVar141;
  puVar4[5] = uVar142;
  puVar4[6] = uVar143;
  puVar4[7] = uVar144;
  puVar4 = output + stride * 7;
  *puVar4 = (-1 < (short)uVar99) * uVar99;
  puVar4[1] = (-1 < (short)uVar103) * uVar103;
  puVar4[2] = (-1 < (short)uVar105) * uVar105;
  puVar4[3] = (-1 < (short)uVar107) * uVar107;
  puVar4[4] = (-1 < (short)uVar26) * uVar26;
  puVar4[5] = (-1 < (short)uVar31) * uVar31;
  puVar4[6] = (-1 < (short)uVar33) * uVar33;
  puVar4[7] = (-1 < (short)uVar36) * uVar36;
  return;
}

Assistant:

static void write_buffer_8x8(__m128i *in, uint16_t *output, int stride,
                             int fliplr, int flipud, int shift, int bd) {
  __m128i u0, u1, u2, u3, u4, u5, u6, u7;
  __m128i v0, v1, v2, v3, v4, v5, v6, v7;

  round_shift_8x8(in, shift);

  v0 = _mm_load_si128((__m128i const *)(output + 0 * stride));
  v1 = _mm_load_si128((__m128i const *)(output + 1 * stride));
  v2 = _mm_load_si128((__m128i const *)(output + 2 * stride));
  v3 = _mm_load_si128((__m128i const *)(output + 3 * stride));
  v4 = _mm_load_si128((__m128i const *)(output + 4 * stride));
  v5 = _mm_load_si128((__m128i const *)(output + 5 * stride));
  v6 = _mm_load_si128((__m128i const *)(output + 6 * stride));
  v7 = _mm_load_si128((__m128i const *)(output + 7 * stride));

  if (flipud) {
    u0 = get_recon_8x8(v0, in[14], in[15], fliplr, bd);
    u1 = get_recon_8x8(v1, in[12], in[13], fliplr, bd);
    u2 = get_recon_8x8(v2, in[10], in[11], fliplr, bd);
    u3 = get_recon_8x8(v3, in[8], in[9], fliplr, bd);
    u4 = get_recon_8x8(v4, in[6], in[7], fliplr, bd);
    u5 = get_recon_8x8(v5, in[4], in[5], fliplr, bd);
    u6 = get_recon_8x8(v6, in[2], in[3], fliplr, bd);
    u7 = get_recon_8x8(v7, in[0], in[1], fliplr, bd);
  } else {
    u0 = get_recon_8x8(v0, in[0], in[1], fliplr, bd);
    u1 = get_recon_8x8(v1, in[2], in[3], fliplr, bd);
    u2 = get_recon_8x8(v2, in[4], in[5], fliplr, bd);
    u3 = get_recon_8x8(v3, in[6], in[7], fliplr, bd);
    u4 = get_recon_8x8(v4, in[8], in[9], fliplr, bd);
    u5 = get_recon_8x8(v5, in[10], in[11], fliplr, bd);
    u6 = get_recon_8x8(v6, in[12], in[13], fliplr, bd);
    u7 = get_recon_8x8(v7, in[14], in[15], fliplr, bd);
  }

  _mm_store_si128((__m128i *)(output + 0 * stride), u0);
  _mm_store_si128((__m128i *)(output + 1 * stride), u1);
  _mm_store_si128((__m128i *)(output + 2 * stride), u2);
  _mm_store_si128((__m128i *)(output + 3 * stride), u3);
  _mm_store_si128((__m128i *)(output + 4 * stride), u4);
  _mm_store_si128((__m128i *)(output + 5 * stride), u5);
  _mm_store_si128((__m128i *)(output + 6 * stride), u6);
  _mm_store_si128((__m128i *)(output + 7 * stride), u7);
}